

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall SimpleString::SimpleString(SimpleString *this,char *otherBuffer)

{
  char *otherBuffer_local;
  SimpleString *this_local;
  
  this->buffer_ = (char *)0x0;
  this->bufferSize_ = 0;
  if (otherBuffer == (char *)0x0) {
    setInternalBufferAsEmptyString(this);
  }
  else {
    copyBufferToNewInternalBuffer(this,otherBuffer);
  }
  return;
}

Assistant:

SimpleString::SimpleString(const char *otherBuffer)
    : buffer_(NULLPTR), bufferSize_(0)
{
    if (otherBuffer == NULLPTR)
        setInternalBufferAsEmptyString();
    else
        copyBufferToNewInternalBuffer(otherBuffer);
}